

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

float xm_envelope_lerp(xm_envelope_point_t *a,xm_envelope_point_t *b,uint16_t pos)

{
  float fVar1;
  float p;
  uint16_t pos_local;
  xm_envelope_point_t *b_local;
  xm_envelope_point_t *a_local;
  float local_4;
  
  if (a->frame < pos) {
    if (pos < b->frame) {
      fVar1 = (float)(int)((uint)pos - (uint)a->frame) /
              (float)(int)((uint)b->frame - (uint)a->frame);
      local_4 = (float)a->value * (1.0 - fVar1) + (float)b->value * fVar1;
    }
    else {
      local_4 = (float)b->value;
    }
  }
  else {
    local_4 = (float)a->value;
  }
  return local_4;
}

Assistant:

static float xm_envelope_lerp(xm_envelope_point_t* restrict a, xm_envelope_point_t* restrict b, uint16_t pos) {
	/* Linear interpolation between two envelope points */
	if(pos <= a->frame) return a->value;
	else if(pos >= b->frame) return b->value;
	else {
		float p = (float)(pos - a->frame) / (float)(b->frame - a->frame);
		return a->value * (1 - p) + b->value * p;
	}
}